

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::BeginDragDropTarget(void)

{
  ImGuiWindow *this;
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  ImGuiID id;
  ImRect *pIVar4;
  
  pIVar2 = GImGui;
  if ((((GImGui->DragDropActive == true) &&
       (uVar3 = (GImGui->LastItemData).StatusFlags, (uVar3 & 1) != 0)) &&
      (GImGui->HoveredWindowUnderMovingWindow != (ImGuiWindow *)0x0)) &&
     ((this = GImGui->CurrentWindow,
      this->RootWindow == GImGui->HoveredWindowUnderMovingWindow->RootWindow &&
      (this->SkipItems == false)))) {
    uVar3 = (uVar3 & 2) << 4;
    pIVar4 = (ImRect *)
             ((long)&(((ImGuiLastItemData *)(&GImGui->NextItemData + 1))->Rect).Min.x + (ulong)uVar3
             );
    id = (GImGui->LastItemData).ID;
    if (id == 0) {
      id = ImGuiWindow::GetIDFromRectangle(this,pIVar4);
      KeepAliveID(id);
    }
    if ((pIVar2->DragDropPayload).SourceId != id) {
      IVar1 = *(ImVec2 *)
               ((long)&(((ImGuiLastItemData *)(&pIVar2->NextItemData + 1))->Rect).Max.x +
               (ulong)uVar3);
      (pIVar2->DragDropTargetRect).Min = pIVar4->Min;
      (pIVar2->DragDropTargetRect).Max = IVar1;
      pIVar4 = &this->ClipRect;
      if (((uint)(pIVar2->LastItemData).StatusFlags >> 9 & 1) != 0) {
        pIVar4 = &(pIVar2->LastItemData).ClipRect;
      }
      IVar1 = pIVar4->Max;
      (pIVar2->DragDropTargetClipRect).Min = pIVar4->Min;
      (pIVar2->DragDropTargetClipRect).Max = IVar1;
      pIVar2->DragDropTargetId = id;
      pIVar2->DragDropWithinTarget = true;
      return true;
    }
  }
  return false;
}

Assistant:

bool ImGui::BeginDragDropTarget()
{
    ImGuiContext& g = *GImGui;
    if (!g.DragDropActive)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (!(g.LastItemData.StatusFlags & ImGuiItemStatusFlags_HoveredRect))
        return false;
    ImGuiWindow* hovered_window = g.HoveredWindowUnderMovingWindow;
    if (hovered_window == NULL || window->RootWindow != hovered_window->RootWindow || window->SkipItems)
        return false;

    const ImRect& display_rect = (g.LastItemData.StatusFlags & ImGuiItemStatusFlags_HasDisplayRect) ? g.LastItemData.DisplayRect : g.LastItemData.Rect;
    ImGuiID id = g.LastItemData.ID;
    if (id == 0)
    {
        id = window->GetIDFromRectangle(display_rect);
        KeepAliveID(id);
    }
    if (g.DragDropPayload.SourceId == id)
        return false;

    IM_ASSERT(g.DragDropWithinTarget == false && g.DragDropWithinSource == false); // Can't nest BeginDragDropSource() and BeginDragDropTarget()
    g.DragDropTargetRect = display_rect;
    g.DragDropTargetClipRect = (g.LastItemData.StatusFlags & ImGuiItemStatusFlags_HasClipRect) ? g.LastItemData.ClipRect : window->ClipRect;
    g.DragDropTargetId = id;
    g.DragDropWithinTarget = true;
    return true;
}